

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall
QMdi::SimpleCascader::rearrange(SimpleCascader *this,QList<QWidget_*> *widgets,QRect *domain)

{
  int iVar1;
  int iVar2;
  QWidget *this_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  LayoutDirection direction;
  int iVar10;
  QStyle *pQVar11;
  long lVar12;
  undefined8 uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int index;
  int iVar18;
  long in_FS_OFFSET;
  char cVar19;
  QFontMetrics fontMetrics;
  QStyleOptionTitleBar options;
  QRect local_d0;
  undefined1 *local_c0;
  QRect local_b8;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((widgets->d).size != 0) {
    local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)local_a8);
    QStyleOption::initFrom((QStyleOption *)local_a8,*(widgets->d).ptr);
    pQVar11 = QWidget::style(*(widgets->d).ptr);
    iVar5 = (**(code **)(*(long *)pQVar11 + 0xe0))
                      (pQVar11,0x1a,(QStyleOptionTitleBar *)local_a8,*(widgets->d).ptr);
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    QApplication::font((QApplication *)&local_b8,"QMdiSubWindowTitleBar");
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_c0,(QFont *)&local_b8);
    QFont::~QFont((QFont *)&local_b8);
    iVar6 = QFontMetrics::height();
    iVar5 = iVar5 - (iVar5 - iVar6) / 2;
    if (iVar5 < 2) {
      iVar5 = 1;
    }
    pQVar11 = QWidget::style(*(widgets->d).ptr);
    index = 0;
    iVar7 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x40,0,*(widgets->d).ptr);
    iVar6 = (int)(widgets->d).size;
    iVar1 = (domain->x2).m_i;
    iVar8 = (((domain->y2).m_i - (domain->y1).m_i) + -0x31) / (iVar7 + iVar5);
    if (iVar8 < 2) {
      iVar8 = 1;
    }
    iVar9 = (iVar6 / iVar8 + 1) - (uint)(iVar6 % iVar8 == 0);
    iVar16 = 1;
    if (1 < iVar9) {
      iVar16 = iVar9;
    }
    iVar2 = (domain->x1).m_i;
    iVar10 = -1;
    iVar14 = 0;
    do {
      iVar15 = iVar14 * (iVar7 + iVar5);
      bVar3 = true;
      iVar17 = 1;
      iVar18 = iVar10;
      do {
        bVar4 = sanityCheck(widgets,index,"SimpleCascader");
        cVar19 = '\a';
        if (bVar4) {
          lVar12 = (long)index;
          index = index + 1;
          this_00 = (widgets->d).ptr[lVar12];
          local_b8.x1.m_i = -0x55555556;
          local_b8.y1.m_i = -0x55555556;
          local_b8.x2.m_i = -0x55555556;
          local_b8.y2.m_i = -0x55555556;
          uVar13 = (**(code **)(*(long *)this_00 + 0x70))(this_00);
          local_b8.x2.m_i = (int)uVar13 + iVar18;
          local_b8.y2.m_i = (int)((ulong)uVar13 >> 0x20) + iVar15 + -1;
          local_b8.x1.m_i = iVar18 + 1;
          local_b8.y1.m_i = iVar15;
          direction = QWidget::layoutDirection(this_00);
          local_d0 = QStyle::visualRect(direction,domain,&local_b8);
          QWidget::setGeometry(this_00,&local_d0);
          cVar19 = index == iVar6;
        }
        if ((cVar19 != '\a') && (cVar19 != '\0')) break;
        bVar3 = iVar17 < iVar9;
        iVar18 = iVar18 + ((iVar1 - iVar2) + -99) / iVar16;
        bVar4 = iVar17 != iVar16;
        iVar17 = iVar17 + 1;
      } while (bVar4);
      if (bVar3) break;
      iVar14 = iVar14 + 1;
      iVar10 = iVar10 + 10;
    } while (iVar14 != iVar8);
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_c0);
    QIcon::~QIcon(&local_48);
    if (pQStack_60 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_60,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SimpleCascader::rearrange(QList<QWidget *> &widgets, const QRect &domain) const
{
    if (widgets.isEmpty())
        return;

    // Tunables:
    const int topOffset = 0;
    const int bottomOffset = 50;
    const int leftOffset = 0;
    const int rightOffset = 100;
    const int dx = 10;

    QStyleOptionTitleBar options;
    options.initFrom(widgets.at(0));
    int titleBarHeight = widgets.at(0)->style()->pixelMetric(QStyle::PM_TitleBarHeight, &options, widgets.at(0));
    const QFontMetrics fontMetrics = QFontMetrics(QApplication::font("QMdiSubWindowTitleBar"));
    const int dy = qMax(titleBarHeight - (titleBarHeight - fontMetrics.height()) / 2, 1)
        + widgets.at(0)->style()->pixelMetric(QStyle::PM_FocusFrameVMargin, nullptr, widgets.at(0));

    const int n = widgets.size();
    const int nrows = qMax((domain.height() - (topOffset + bottomOffset)) / dy, 1);
    const int ncols = qMax(n / nrows + ((n % nrows) ? 1 : 0), 1);
    const int dcol = (domain.width() - (leftOffset + rightOffset)) / ncols;

    int i = 0;
    for (int row = 0; row < nrows; ++row) {
        for (int col = 0; col < ncols; ++col) {
            const int x = leftOffset + row * dx + col * dcol;
            const int y = topOffset + row * dy;
            if (!sanityCheck(widgets, i, "SimpleCascader"))
                continue;
            QWidget *widget = widgets.at(i++);
            QRect newGeometry = QRect(QPoint(x, y), widget->sizeHint());
            widget->setGeometry(QStyle::visualRect(widget->layoutDirection(), domain, newGeometry));
            if (i == n)
                return;
        }
    }
}